

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

void __thiscall
fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>>>::
write_int<wchar_t,fmt::v5::basic_format_specs<wchar_t>>
          (basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>>> *this,
          wchar_t value,basic_format_specs<wchar_t> *spec)

{
  wchar_t wVar1;
  int_writer<wchar_t,_fmt::v5::basic_format_specs<wchar_t>_> local_20;
  
  wVar1 = spec->type_;
  local_20.prefix_size = 0;
  if (value < L'\0') {
    local_20.prefix[0] = '-';
    local_20.prefix_size = 1;
    local_20.abs_value = -value;
  }
  else {
    local_20.abs_value = value;
    if ((spec->flags_ & 1) != 0) {
      local_20.prefix[0] = '+';
      if ((spec->flags_ & 2) == 0) {
        local_20.prefix[0] = ' ';
      }
      local_20.prefix_size = 1;
    }
  }
  local_20.writer =
       (basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>_>_> *)this;
  local_20.spec = spec;
  if (wVar1 < L'd') {
    if (wVar1 < L'X') {
      if (wVar1 == L'\0') {
LAB_0012dbe2:
        basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>_>_>::
        int_writer<wchar_t,_fmt::v5::basic_format_specs<wchar_t>_>::on_dec(&local_20);
        return;
      }
      if (wVar1 == L'B') {
LAB_0012dbc0:
        basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>_>_>::
        int_writer<wchar_t,_fmt::v5::basic_format_specs<wchar_t>_>::on_bin(&local_20);
        return;
      }
    }
    else {
      if (wVar1 == L'X') {
LAB_0012dbd6:
        basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>_>_>::
        int_writer<wchar_t,_fmt::v5::basic_format_specs<wchar_t>_>::on_hex(&local_20);
        return;
      }
      if (wVar1 == L'b') goto LAB_0012dbc0;
    }
  }
  else if (wVar1 < L'o') {
    if (wVar1 == L'd') goto LAB_0012dbe2;
    if (wVar1 == L'n') {
      basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>_>_>::
      int_writer<wchar_t,_fmt::v5::basic_format_specs<wchar_t>_>::on_num(&local_20);
      return;
    }
  }
  else {
    if (wVar1 == L'o') {
      basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>_>_>::
      int_writer<wchar_t,_fmt::v5::basic_format_specs<wchar_t>_>::on_oct(&local_20);
      return;
    }
    if (wVar1 == L'x') goto LAB_0012dbd6;
  }
  basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>_>_>::
  int_writer<wchar_t,_fmt::v5::basic_format_specs<wchar_t>_>::on_error(&local_20);
  return;
}

Assistant:

void write_int(T value, const Spec &spec) {
    internal::handle_int_type_spec(spec.type(),
                                   int_writer<T, Spec>(*this, value, spec));
  }